

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Descriptor * __thiscall google::protobuf::MethodDescriptor::input_type(MethodDescriptor *this)

{
  LazyDescriptor *local_10;
  
  if (*(once_flag **)(this + 0x28) != (once_flag *)0x0) {
    local_10 = (LazyDescriptor *)(this + 0x18);
    std::
    call_once<void(&)(google::protobuf::internal::LazyDescriptor*),google::protobuf::internal::LazyDescriptor*>
              (*(once_flag **)(this + 0x28),internal::LazyDescriptor::OnceStatic,&local_10);
  }
  return ((LazyDescriptor *)(this + 0x18))->descriptor_;
}

Assistant:

const Descriptor* MethodDescriptor::input_type() const {
  return input_type_.Get();
}